

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiverImpl.cpp
# Opt level: O2

Bool __thiscall Diligent::ArchiverImpl::AddPipelineState(ArchiverImpl *this,IPipelineState *pPSO)

{
  mutex *__mutex;
  char *_Name;
  IRenderPass *pRP;
  bool bVar1;
  ResourceType _Type;
  int iVar2;
  undefined4 extraout_var;
  char (*in_R8) [92];
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>_>,_false,_false>,_bool>
  pVar3;
  RefCntAutoPtr<Diligent::SerializedPipelineStateImpl> pSerializedPSO;
  string msg;
  Char *Name;
  
  if (pPSO == (IPipelineState *)0x0) {
    return false;
  }
  RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>::RefCntAutoPtr
            (&pSerializedPSO,(IObject *)pPSO,(INTERFACE_ID *)IID_SerializedPipelineState);
  if (pSerializedPSO.m_pObject == (SerializedPipelineStateImpl *)0x0) {
    iVar2 = (*(pPSO->super_IDeviceObject).super_IObject._vptr_IObject[4])(pPSO);
    FormatString<char[17],char_const*,char[45]>
              (&msg,(Diligent *)"Pipeline state \'",(char (*) [17])CONCAT44(extraout_var,iVar2),
               (char **)"\' was not created by a serialization device.",(char (*) [45])in_R8);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"AddPipelineState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverImpl.cpp"
               ,0x144);
    std::__cxx11::string::~string((string *)&msg);
  }
  else {
    _Name = ((pSerializedPSO.m_pObject)->m_Desc).super_DeviceObjectAttribs.Name;
    Name = _Name;
    _Type = PipelineTypeToArchiveResourceType(((pSerializedPSO.m_pObject)->m_Desc).PipelineType);
    __mutex = &this->m_PipelinesMtx;
    std::mutex::lock(__mutex);
    DeviceObjectArchive::NamedResourceKey::NamedResourceKey
              ((NamedResourceKey *)&msg,_Type,_Name,true);
    pVar3 = std::
            _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>>,std::allocator<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>>>,std::__detail::_Select1st,std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_emplace<Diligent::DeviceObjectArchive::NamedResourceKey,Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>&>
                      ((_Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>>,std::allocator<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>>>,std::__detail::_Select1st,std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&this->m_Pipelines,&msg,&pSerializedPSO);
    HashMapStringKey::Clear((HashMapStringKey *)&msg._M_string_length);
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      pRP = ((pSerializedPSO.m_pObject)->m_pRenderPass).m_pObject;
      if (pRP == (IRenderPass *)0x0) {
        bVar1 = true;
      }
      else {
        bVar1 = AddRenderPass(this,pRP);
      }
      goto LAB_001c4a23;
    }
    FormatString<char[27],char_const*,char[92]>
              (&msg,(Diligent *)"Pipeline state with name \'",(char (*) [27])&Name,
               (char **)
               "\' is already present in the archive. All pipelines of the same type must have unique names."
               ,in_R8);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&msg);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  bVar1 = false;
LAB_001c4a23:
  RefCntAutoPtr<Diligent::SerializedPipelineStateImpl>::Release(&pSerializedPSO);
  return bVar1;
}

Assistant:

Bool ArchiverImpl::AddPipelineState(IPipelineState* pPSO)
{
    if (pPSO == nullptr)
        return false;

    RefCntAutoPtr<SerializedPipelineStateImpl> pSerializedPSO{pPSO, IID_SerializedPipelineState};
    if (!pSerializedPSO)
    {
        UNEXPECTED("Pipeline state '", pPSO->GetDesc().Name, "' was not created by a serialization device.");
        return false;
    }

    const auto& Desc = pSerializedPSO->GetDesc();
    const auto* Name = Desc.Name;
    // Mesh pipelines are serialized as graphics pipelines
    const auto ArchiveResType = PipelineTypeToArchiveResourceType(Desc.PipelineType);

    {
        std::lock_guard<std::mutex> Guard{m_PipelinesMtx};

        auto it_inserted = m_Pipelines.emplace(NamedResourceKey{ArchiveResType, Name, true}, pSerializedPSO);
        if (!it_inserted.second)
        {
            LOG_ERROR_MESSAGE("Pipeline state with name '", Name, "' is already present in the archive. All pipelines of the same type must have unique names.");
            return false;
        }
    }

    bool Res = true;
    if (auto* pRenderPass = pSerializedPSO->GetRenderPass())
    {
        if (!AddRenderPass(pRenderPass))
            Res = false;
    }

    return Res;
}